

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.c
# Opt level: O3

void al_destroy_audio_recorder(ALLEGRO_AUDIO_RECORDER *r)

{
  ulong uVar1;
  
  if (r != (ALLEGRO_AUDIO_RECORDER *)0x0) {
    if (r->thread != (ALLEGRO_THREAD *)0x0) {
      al_set_thread_should_stop();
      al_lock_mutex(r->mutex);
      r->is_recording = false;
      al_signal_cond(r->cond);
      al_unlock_mutex(r->mutex);
      al_join_thread(r->thread,0);
      al_destroy_thread(r->thread);
    }
    if (_al_kcm_driver->deallocate_recorder != (_func_void_ALLEGRO_AUDIO_RECORDER_ptr *)0x0) {
      (*_al_kcm_driver->deallocate_recorder)(r);
    }
    al_destroy_user_event_source(r);
    al_destroy_mutex(r->mutex);
    al_destroy_cond(r->cond);
    if (r->fragment_count != 0) {
      uVar1 = 0;
      do {
        al_free_with_context
                  (r->fragments[uVar1],0xab,
                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/recorder.c"
                   ,"al_destroy_audio_recorder");
        uVar1 = uVar1 + 1;
      } while (uVar1 < r->fragment_count);
    }
    al_free_with_context
              (r->fragments,0xad,
               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/recorder.c"
               ,"al_destroy_audio_recorder");
    al_free_with_context
              (r,0xae,
               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/recorder.c"
               ,"al_destroy_audio_recorder");
    return;
  }
  return;
}

Assistant:

void al_destroy_audio_recorder(ALLEGRO_AUDIO_RECORDER *r)
{
   size_t i;

   if (!r)
      return;

   if (r->thread) {
      al_set_thread_should_stop(r->thread);
      
      al_lock_mutex(r->mutex);
      r->is_recording = false;
      al_signal_cond(r->cond);
      al_unlock_mutex(r->mutex);
   
      al_join_thread(r->thread, NULL);
      al_destroy_thread(r->thread);
    }
   
   if (_al_kcm_driver->deallocate_recorder) {
      _al_kcm_driver->deallocate_recorder(r);
   }
   
   al_destroy_user_event_source(&r->source);     
   al_destroy_mutex(r->mutex);
   al_destroy_cond(r->cond);
   
   for (i = 0; i < r->fragment_count; ++i) {
      al_free(r->fragments[i]);
   }
   al_free(r->fragments);
   al_free(r);
}